

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

png_uint_32 transform_height(png_const_structp pp,png_byte colour_type,png_byte bit_depth)

{
  uint uVar1;
  png_byte bit_depth_local;
  png_byte colour_type_local;
  png_const_structp pp_local;
  
  uVar1 = bit_size(pp,colour_type,bit_depth);
  switch(uVar1) {
  case 1:
  case 2:
  case 4:
    pp_local._4_4_ = 1;
    break;
  default:
    pp_local._4_4_ = 0;
    break;
  case 8:
    pp_local._4_4_ = 2;
    break;
  case 0x10:
    pp_local._4_4_ = 0x200;
    break;
  case 0x18:
  case 0x20:
    pp_local._4_4_ = 0x200;
    break;
  case 0x30:
  case 0x40:
    pp_local._4_4_ = 0x800;
  }
  return pp_local._4_4_;
}

Assistant:

static png_uint_32
transform_height(png_const_structp pp, png_byte colour_type, png_byte bit_depth)
{
   switch (bit_size(pp, colour_type, bit_depth))
   {
      case 1:
      case 2:
      case 4:
         return 1;   /* Total of 128 pixels */

      case 8:
         return 2;   /* Total of 256 pixels/bytes */

      case 16:
         return 512; /* Total of 65536 pixels */

      case 24:
      case 32:
         return 512; /* 65536 pixels */

      case 48:
      case 64:
         return 2048;/* 4 x 65536 pixels. */
#        define TRANSFORM_HEIGHTMAX 2048

      default:
         return 0;   /* Error, will be caught later */
   }
}